

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_tests.cpp
# Opt level: O0

void logging_tests::logging_Conf_invoker(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_wrap_stringstream<char> *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long in_FS_OFFSET;
  logging_Conf t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff158;
  std_string *in_stack_fffffffffffff160;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff168;
  const_string *in_stack_fffffffffffff180;
  size_t in_stack_fffffffffffff188;
  undefined1 *__s;
  const_string *in_stack_fffffffffffff190;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffff198;
  undefined1 local_cd0 [408];
  undefined1 local_b38 [408];
  undefined1 local_9a0 [408];
  undefined1 local_808 [408];
  logging_Conf local_670;
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,
             (pointer)in_stack_fffffffffffff160,(unsigned_long)in_stack_fffffffffffff158);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff158);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff158);
  boost::operator<<(in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [13])in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [15])in_stack_fffffffffffff160);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff168);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190,in_stack_fffffffffffff188,
             in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff158);
  logging_Conf::logging_Conf((logging_Conf *)in_stack_fffffffffffff158);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,
             (pointer)in_stack_fffffffffffff160,(unsigned_long)in_stack_fffffffffffff158);
  memset(local_808,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff158);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff158);
  boost::operator<<(in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [13])in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [16])in_stack_fffffffffffff160);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff168);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190,in_stack_fffffffffffff188,
             in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff158);
  boost::unit_test::setup_conditional<logging_tests::logging_Conf>((logging_Conf *)0x6f85d0);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,
             (pointer)in_stack_fffffffffffff160,(unsigned_long)in_stack_fffffffffffff158);
  memset(local_9a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff158);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff158);
  boost::operator<<(in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [13])in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [13])in_stack_fffffffffffff160);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff168);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff198,in_stack_fffffffffffff190,in_stack_fffffffffffff188,
             in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff158);
  logging_Conf::test_method(&local_670);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,
             (pointer)in_stack_fffffffffffff160,(unsigned_long)in_stack_fffffffffffff158);
  memset(local_b38,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff158);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff158);
  boost::operator<<(in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [13])in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [19])in_stack_fffffffffffff160);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff168);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,in_stack_fffffffffffff190,in_stack_fffffffffffff188,
             in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff158);
  boost::unit_test::teardown_conditional<logging_tests::logging_Conf>((logging_Conf *)0x6f87fc);
  file = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff168,
             (pointer)in_stack_fffffffffffff160,(unsigned_long)in_stack_fffffffffffff158);
  __s = local_cd0;
  memset(__s,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff158);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff158);
  msg = boost::operator<<(in_stack_fffffffffffff168,(char *)in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [13])in_stack_fffffffffffff160);
  boost::operator<<(in_stack_fffffffffffff168,(char (*) [15])in_stack_fffffffffffff160);
  this_00 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff168);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this_00,in_stack_fffffffffffff160);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,file,(size_t)__s,(const_string *)msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff158);
  logging_Conf::~logging_Conf((logging_Conf *)in_stack_fffffffffffff158);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(logging_Conf, LogSetup)
{
    // Set global log level
    {
        ResetLogger();
        ArgsManager args;
        args.AddArg("-loglevel", "...", ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);
        const char* argv_test[] = {"bitcoind", "-loglevel=debug"};
        std::string err;
        BOOST_REQUIRE(args.ParseParameters(2, argv_test, err));

        auto result = init::SetLoggingLevel(args);
        BOOST_REQUIRE(result);
        BOOST_CHECK_EQUAL(LogInstance().LogLevel(), BCLog::Level::Debug);
    }

    // Set category-specific log level
    {
        ResetLogger();
        ArgsManager args;
        args.AddArg("-loglevel", "...", ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);
        const char* argv_test[] = {"bitcoind", "-loglevel=net:trace"};
        std::string err;
        BOOST_REQUIRE(args.ParseParameters(2, argv_test, err));

        auto result = init::SetLoggingLevel(args);
        BOOST_REQUIRE(result);
        BOOST_CHECK_EQUAL(LogInstance().LogLevel(), BCLog::DEFAULT_LOG_LEVEL);

        const auto& category_levels{LogInstance().CategoryLevels()};
        const auto net_it{category_levels.find(BCLog::LogFlags::NET)};
        BOOST_REQUIRE(net_it != category_levels.end());
        BOOST_CHECK_EQUAL(net_it->second, BCLog::Level::Trace);
    }

    // Set both global log level and category-specific log level
    {
        ResetLogger();
        ArgsManager args;
        args.AddArg("-loglevel", "...", ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);
        const char* argv_test[] = {"bitcoind", "-loglevel=debug", "-loglevel=net:trace", "-loglevel=http:info"};
        std::string err;
        BOOST_REQUIRE(args.ParseParameters(4, argv_test, err));

        auto result = init::SetLoggingLevel(args);
        BOOST_REQUIRE(result);
        BOOST_CHECK_EQUAL(LogInstance().LogLevel(), BCLog::Level::Debug);

        const auto& category_levels{LogInstance().CategoryLevels()};
        BOOST_CHECK_EQUAL(category_levels.size(), 2);

        const auto net_it{category_levels.find(BCLog::LogFlags::NET)};
        BOOST_CHECK(net_it != category_levels.end());
        BOOST_CHECK_EQUAL(net_it->second, BCLog::Level::Trace);

        const auto http_it{category_levels.find(BCLog::LogFlags::HTTP)};
        BOOST_CHECK(http_it != category_levels.end());
        BOOST_CHECK_EQUAL(http_it->second, BCLog::Level::Info);
    }
}